

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLib.c
# Opt level: O3

Abc_Ntk_t * Abc_DesDeriveRoot(Abc_Des_t *p)

{
  Vec_Ptr_t *pVVar1;
  Abc_Ntk_t *pAVar2;
  
  pVVar1 = p->vModules;
  if (pVVar1->nSize < 2) {
    if (pVVar1->nSize != 1) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    pAVar2 = (Abc_Ntk_t *)*pVVar1->pArray;
    pVVar1->nSize = 0;
    pAVar2->pManFunc = p->pManFunc;
    p->pManFunc = (void *)0x0;
  }
  else {
    puts("The design includes more than one module and is currently not used.");
    pAVar2 = (Abc_Ntk_t *)0x0;
  }
  return pAVar2;
}

Assistant:

Abc_Ntk_t * Abc_DesDeriveRoot( Abc_Des_t * p )
{
    Abc_Ntk_t * pNtk;
    if ( Vec_PtrSize(p->vModules) > 1 )
    {
        printf( "The design includes more than one module and is currently not used.\n" );
        return NULL;
    }
    pNtk = (Abc_Ntk_t *)Vec_PtrEntry( p->vModules, 0 );  Vec_PtrClear( p->vModules );
    pNtk->pManFunc = p->pManFunc;           p->pManFunc = NULL;
    return pNtk;
}